

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O1

int sfi::logic::getBase(string *addr)

{
  pointer pcVar1;
  long lVar2;
  istream *piVar3;
  int iVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  string tmp;
  string octet;
  istringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  value_type local_1c0;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  lVar2 = std::__cxx11::string::find((char)addr,0x78);
  iVar4 = 0x10;
  if (lVar2 == -1) {
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::istringstream::istringstream(local_1a0,(string *)addr,_S_in);
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1a0,(string *)&local_1c0,'.'),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1f8,&local_1c0);
    }
    if ((ulong)((long)local_1f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      pcVar1 = ((local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_1e0 = local_1d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar1,
                 pcVar1 + (local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      if (local_1d8 == 0) {
        iVar5 = 0;
      }
      else {
        lVar2 = 0;
        iVar5 = 0;
        do {
          iVar4 = (char)local_1e0[lVar2] + -0x30;
          if ((char)local_1e0[lVar2] + -0x30 <= iVar5) {
            iVar4 = iVar5;
          }
          iVar5 = iVar4;
          lVar2 = lVar2 + 1;
        } while (local_1d8 != lVar2);
      }
      if (((1 < iVar5) ||
          (iVar4 = 2,
          (local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length < 0x15)) &&
         ((7 < iVar5 ||
          (iVar4 = 8,
          (local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0xc)))) {
        iVar4 = 10;
      }
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0);
      }
    }
    else {
      iVar4 = 2;
      if ((local_1f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 8) {
        iVar4 = (uint)((local_1f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 4) * 2 + 8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream(local_1a0);
    std::ios_base::~ios_base(local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
  }
  return iVar4;
}

Assistant:

static int sfi::logic::getBase(const string& addr) {
    if (addr.find('x') != -1) {
        return 16;
    } else {

        vector<string> octets;
        istringstream ss(addr);
        string octet;
        while (getline(ss, octet, '.')) {
            octets.push_back(octet);
        }
        if (octets.size() > 1) {
//            for (const auto &o : octets) {
                if (octets[0].length() == 8)
                    return 2;
                else if (octets[0].length() == 4)
                    return 8;
                else
                    return 10;

//            }
        } else {
            int max =0 ;
            int digit;
            string tmp = octets[0];
            for (const auto& a : tmp) {
                digit = a - '0';
                if (digit > max) {
                    max = digit;
                }
            }
            if (max < 2 && octets[0].size() > 20){
                return 2;
            } else if (max < 8 && octets[0].size() == 12) {
                return 8;
            } else {
                return 10;
            }
        }
    }
}